

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O3

void __thiscall Connection::exchange_data(Connection *this,fd_set *rdfds,fd_set *wrfds)

{
  uint uVar1;
  uint uVar2;
  ssize_t sVar3;
  int *piVar4;
  
  if (this->data_c_f_ == 0) {
    uVar1 = this->client_socket_;
    uVar2 = uVar1 + 0x3f;
    if (-1 < (int)uVar1) {
      uVar2 = uVar1;
    }
    if (((ulong)rdfds->fds_bits[(int)uVar2 >> 6] >> ((ulong)uVar1 & 0x3f) & 1) != 0) {
      sVar3 = recv(uVar1,(this->buf_cf_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start,this->kBufSize,0);
      this->data_c_f_ = sVar3;
      if (sVar3 == 0) {
LAB_00103e7f:
        this->active_ = false;
      }
      else if (sVar3 == -1) {
        piVar4 = __errno_location();
        if (*piVar4 != 0xb) goto LAB_00103e7f;
        this->data_c_f_ = 0;
      }
    }
  }
  if (this->data_f_c_ == 0) {
    uVar1 = this->forwarding_socket_;
    uVar2 = uVar1 + 0x3f;
    if (-1 < (int)uVar1) {
      uVar2 = uVar1;
    }
    if (((ulong)rdfds->fds_bits[(int)uVar2 >> 6] >> ((ulong)uVar1 & 0x3f) & 1) != 0) {
      sVar3 = recv(uVar1,(this->buf_fc_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start,this->kBufSize,0);
      this->data_f_c_ = sVar3;
      if (sVar3 != 0) {
        if (sVar3 != -1) goto LAB_00103d1c;
        piVar4 = __errno_location();
        if (*piVar4 == 0xb) {
          this->data_f_c_ = 0;
          goto LAB_00103d1c;
        }
      }
      this->active_ = false;
    }
  }
LAB_00103d1c:
  if (0 < this->data_c_f_) {
    uVar1 = this->forwarding_socket_;
    uVar2 = uVar1 + 0x3f;
    if (-1 < (int)uVar1) {
      uVar2 = uVar1;
    }
    if (((ulong)wrfds->fds_bits[(int)uVar2 >> 6] >> ((ulong)uVar1 & 0x3f) & 1) != 0) {
      sVar3 = send(uVar1,(this->buf_cf_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start,this->data_c_f_,0);
      if (sVar3 == -1) {
        piVar4 = __errno_location();
        if (*piVar4 != 0xb) {
          this->active_ = false;
        }
      }
      else {
        this->data_c_f_ = 0;
      }
    }
  }
  if (0 < this->data_f_c_) {
    uVar1 = this->client_socket_;
    uVar2 = uVar1 + 0x3f;
    if (-1 < (int)uVar1) {
      uVar2 = uVar1;
    }
    if (((ulong)wrfds->fds_bits[(int)uVar2 >> 6] >> ((ulong)uVar1 & 0x3f) & 1) != 0) {
      sVar3 = send(uVar1,(this->buf_fc_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start,this->data_f_c_,0);
      if (sVar3 == -1) {
        piVar4 = __errno_location();
        if (*piVar4 != 0xb) {
          this->active_ = false;
        }
      }
      else {
        this->data_f_c_ = 0;
      }
    }
  }
  return;
}

Assistant:

void Connection::exchange_data(const fd_set &rdfds, const fd_set &wrfds) {
    if (data_c_f_ == 0 && FD_ISSET(client_socket_, &rdfds)) {
        data_c_f_ = ::recv(client_socket_, &buf_cf_[0], kBufSize, 0);
        if (data_c_f_ == 0 || (data_c_f_ == -1 && errno != EWOULDBLOCK)) {
            active_ = false;
        }
        if (data_c_f_ == -1 && errno == EWOULDBLOCK) {
            data_c_f_ = 0;
        }
    }
    if (data_f_c_ == 0 && FD_ISSET(forwarding_socket_, &rdfds)) {
        data_f_c_ = ::recv(forwarding_socket_, &buf_fc_[0], kBufSize, 0);
        if (data_f_c_ == 0 || (data_f_c_ == -1 && errno != EWOULDBLOCK)) {
            active_ = false;
        }
        if (data_f_c_ == -1 && errno == EWOULDBLOCK) {
            data_f_c_ = 0;
        }
    }
    if (data_c_f_ > 0 && FD_ISSET(forwarding_socket_, &wrfds)) {
        ssize_t res = send(forwarding_socket_, &buf_cf_[0], data_c_f_, 0);
        if (res == -1) {
            if (errno != EWOULDBLOCK) {
                active_ = false;
            }
        } else data_c_f_ = 0;
    }
    if (data_f_c_ > 0 && FD_ISSET(client_socket_, &wrfds)) {
        ssize_t res = send(client_socket_, &buf_fc_[0], data_f_c_, 0);
        if (res == -1) {
            if (errno != EWOULDBLOCK) {
                active_ = false;
            }
        } else data_f_c_ = 0;
    }

}